

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svlogd.c
# Opt level: O0

uint rotate(logdir *ld)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  bool bVar4;
  char local_48 [8];
  char tmp [41];
  logdir *ld_local;
  
  if (ld->fddir == -1) {
    ld->tmax = 0;
    ld_local._4_4_ = 0;
  }
  else {
    unique0x10000502 = ld;
    if (ld->ppid != 0) {
      do {
        uVar1 = processorstop(stack0xffffffffffffffe8);
      } while (uVar1 == 0);
    }
    while (iVar2 = fchdir(stack0xffffffffffffffe8->fddir), iVar2 == -1) {
      pause2("unable to change directory, want rotate",stack0xffffffffffffffe8->name);
    }
    stack0xffffffffffffffe8->fnsave[0x19] = '.';
    if ((stack0xffffffffffffffe8->processor).len == 0) {
      stack0xffffffffffffffe8->fnsave[0x1a] = 's';
    }
    else {
      stack0xffffffffffffffe8->fnsave[0x1a] = 'u';
    }
    stack0xffffffffffffffe8->fnsave[0x1b] = '\0';
    do {
      taia_now(&now);
      fmt_taia(stack0xffffffffffffffe8->fnsave,&now);
      piVar3 = __errno_location();
      *piVar3 = 0;
      iVar2 = stat(stack0xffffffffffffffe8->fnsave,(stat *)&st);
      bVar4 = true;
      if (iVar2 == -1) {
        piVar3 = __errno_location();
        bVar4 = *piVar3 != error_noent;
      }
    } while (bVar4);
    if ((stack0xffffffffffffffe8->tmax != 0) &&
       (iVar2 = taia_less(&stack0xffffffffffffffe8->trotate,&now), iVar2 != 0)) {
      taia_uint(&stack0xffffffffffffffe8->trotate,(uint)stack0xffffffffffffffe8->tmax);
      taia_add(&stack0xffffffffffffffe8->trotate,&now,&stack0xffffffffffffffe8->trotate);
      iVar2 = taia_less(&stack0xffffffffffffffe8->trotate,&trotate);
      if (iVar2 != 0) {
        trotate.sec.x = (stack0xffffffffffffffe8->trotate).sec.x;
        trotate.nano = (stack0xffffffffffffffe8->trotate).nano;
        trotate.atto = (stack0xffffffffffffffe8->trotate).atto;
      }
    }
    if (stack0xffffffffffffffe8->size != 0) {
      buffer_flush(&stack0xffffffffffffffe8->b);
      while (iVar2 = fsync(stack0xffffffffffffffe8->fdcur), iVar2 == -1) {
        pause2("unable to fsync current logfile",stack0xffffffffffffffe8->name);
      }
      while (iVar2 = fchmod(stack0xffffffffffffffe8->fdcur,0x1e4), iVar2 == -1) {
        pause2("unable to set mode of current",stack0xffffffffffffffe8->name);
      }
      close(stack0xffffffffffffffe8->fdcur);
      if (verbose != 0) {
        local_48[0] = ' ';
        uVar1 = fmt_ulong(local_48 + 1,stack0xffffffffffffffe8->size);
        local_48[uVar1 + 1] = '\0';
        strerr_warn("svlogd: info: ","rename: ",stack0xffffffffffffffe8->name,"/current ",
                    stack0xffffffffffffffe8->fnsave,local_48,(strerr *)0x0);
      }
      while (iVar2 = rename("current",stack0xffffffffffffffe8->fnsave), iVar2 == -1) {
        pause2("unable to rename current",stack0xffffffffffffffe8->name);
      }
      while( true ) {
        iVar2 = open_append("current");
        stack0xffffffffffffffe8->fdcur = iVar2;
        if (iVar2 != -1) break;
        pause2("unable to create new current",stack0xffffffffffffffe8->name);
      }
      coe(stack0xffffffffffffffe8->fdcur);
      stack0xffffffffffffffe8->size = 0;
      while (iVar2 = fchmod(stack0xffffffffffffffe8->fdcur,0x1a4), iVar2 == -1) {
        pause2("unable to set mode of current",stack0xffffffffffffffe8->name);
      }
      rmoldest(stack0xffffffffffffffe8);
      processorstart(stack0xffffffffffffffe8);
    }
    while (iVar2 = fchdir(fdwdir), iVar2 == -1) {
      pause1("unable to change to initial working directory");
    }
    ld_local._4_4_ = 1;
  }
  return ld_local._4_4_;
}

Assistant:

unsigned int rotate(struct logdir *ld) {
  char tmp[FMT_ULONG +1];

  if (ld->fddir == -1) { ld->tmax =0; return(0); }
  if (ld->ppid) while(! processorstop(ld));

  while (fchdir(ld->fddir) == -1)
    pause2("unable to change directory, want rotate", ld->name);

  /* create new filename */
  ld->fnsave[25] ='.';
  if (ld->processor.len)
    ld->fnsave[26] ='u';
  else
    ld->fnsave[26] ='s';
  ld->fnsave[27] =0;
  do {
    taia_now(&now);
    fmt_taia(ld->fnsave, &now);
    errno =0;
  } while ((stat(ld->fnsave, &st) != -1) || (errno != error_noent));

  if (ld->tmax && taia_less(&ld->trotate, &now)) {
    taia_uint(&ld->trotate, ld->tmax);
    taia_add(&ld->trotate, &now, &ld->trotate);
    if (taia_less(&ld->trotate, &trotate)) trotate =ld->trotate;
  }

  if (ld->size > 0) {
    buffer_flush(&ld->b);
    while (fsync(ld->fdcur) == -1)
      pause2("unable to fsync current logfile", ld->name);
    while (fchmod(ld->fdcur, 0744) == -1)
      pause2("unable to set mode of current", ld->name);
    close(ld->fdcur);
    if (verbose) {
      tmp[0] =' '; tmp[fmt_ulong(tmp +1, ld->size) +1] =0;
      strerr_warn6(INFO, "rename: ", ld->name, "/current ",
                   ld->fnsave, tmp, 0);
    }
    while (rename("current", ld->fnsave) == -1)
      pause2("unable to rename current", ld->name);
    while ((ld->fdcur =open_append("current")) == -1)
      pause2("unable to create new current", ld->name);
    coe(ld->fdcur);
    ld->size =0;
    while (fchmod(ld->fdcur, 0644) == -1)
      pause2("unable to set mode of current", ld->name);
    rmoldest(ld);
    processorstart(ld);
  }

  while (fchdir(fdwdir) == -1)
    pause1("unable to change to initial working directory");
  return(1);
}